

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageIOTests.cpp
# Opt level: O0

void __thiscall dit::ImageReadCase::~ImageReadCase(ImageReadCase *this)

{
  ImageReadCase *this_local;
  
  ~ImageReadCase(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

ImageReadCase (tcu::TestContext& testCtx, const char* name, const char* filename, deUint32 expectedHash)
		: TestCase			(testCtx, name, filename)
		, m_filename		(filename)
		, m_expectedHash	(expectedHash)
	{
	}